

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOLoader.cpp
# Opt level: O0

void __thiscall Assimp::LWOImporter::LWOImporter(LWOImporter *this)

{
  LWOImporter *this_local;
  
  BaseImporter::BaseImporter(&this->super_BaseImporter);
  (this->super_BaseImporter)._vptr_BaseImporter = (_func_int **)&PTR_UpdateImporterScale_00edba30;
  this->mIsLWO2 = false;
  this->mIsLXOB = false;
  this->mLayers = (LayerList *)0x0;
  this->mCurLayer = (Layer *)0x0;
  this->mTags = (TagList *)0x0;
  this->mMapping = (TagMappingTable *)0x0;
  this->mSurfaces = (SurfaceList *)0x0;
  std::vector<Assimp::LWO::Clip,_std::allocator<Assimp::LWO::Clip>_>::vector(&this->mClips);
  std::vector<Assimp::LWO::Envelope,_std::allocator<Assimp::LWO::Envelope>_>::vector
            (&this->mEnvelopes);
  this->mFileBuffer = (uint8_t *)0x0;
  this->fileSize = 0;
  this->pScene = (aiScene *)0x0;
  this->configSpeedFlag = false;
  this->configLayerIndex = 0;
  std::__cxx11::string::string((string *)&this->configLayerName);
  this->hasNamedLayer = false;
  return;
}

Assistant:

LWOImporter::LWOImporter()
    : mIsLWO2(),
    mIsLXOB(),
    mLayers(),
    mCurLayer(),
    mTags(),
    mMapping(),
    mSurfaces(),
    mFileBuffer(),
    fileSize(),
    pScene(),
    configSpeedFlag(),
    configLayerIndex(),
    hasNamedLayer()
{}